

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::PtrType_abi_cxx11_(CppGenerator *this,FieldDef *field)

{
  string *local_90;
  Value *local_80;
  allocator<char> local_41;
  string local_40;
  Value *attr;
  FieldDef *field_local;
  CppGenerator *this_local;
  
  if (field == (FieldDef *)0x0) {
    local_80 = (Value *)0x0;
  }
  else {
    attr = (Value *)field;
    field_local = (FieldDef *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"cpp_ptr_type",&local_41)
    ;
    local_80 = SymbolTable<flatbuffers::Value>::Lookup
                         (&(field->super_Definition).attributes,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  if (local_80 == (Value *)0x0) {
    local_90 = &(this->opts_).super_IDLOptions.cpp_object_api_pointer_type;
  }
  else {
    local_90 = &local_80->constant;
  }
  return local_90;
}

Assistant:

const std::string &PtrType(const FieldDef *field) {
    auto attr = field ? field->attributes.Lookup("cpp_ptr_type") : nullptr;
    return attr ? attr->constant : opts_.cpp_object_api_pointer_type;
  }